

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int Amap_LibCreateVar(Amap_Lib_t *p)

{
  Amap_Nod_t *pAVar1;
  Amap_Nod_t *pNode;
  Amap_Lib_t *p_local;
  
  if (p->pNodes == (Amap_Nod_t *)0x0) {
    p->nNodesAlloc = 0x100;
    pAVar1 = (Amap_Nod_t *)malloc((long)p->nNodesAlloc * 0x18);
    p->pNodes = pAVar1;
    Amap_LibCreateObj(p);
    *(uint *)p->pNodes = *(uint *)p->pNodes & 0xffffff | 0x2000000;
    *(uint *)p->pNodes = *(uint *)p->pNodes & 0xff00ffff | 0x10000;
    return 0;
  }
  __assert_fail("p->pNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapUniq.c"
                ,0xa8,"int Amap_LibCreateVar(Amap_Lib_t *)");
}

Assistant:

int Amap_LibCreateVar( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    // start the manager
    assert( p->pNodes == NULL );
    p->nNodesAlloc = 256;
    p->pNodes = ABC_ALLOC( Amap_Nod_t, p->nNodesAlloc );
    // create the first node
    pNode = Amap_LibCreateObj( p );
    p->pNodes->Type = AMAP_OBJ_PI;
    p->pNodes->nSuppSize = 1;
    return 0;
}